

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptlsbench.c
# Opt level: O0

int bench_run_one(ptls_aead_context_t *e,ptls_aead_context_t *d,size_t n,size_t l,uint64_t *t_enc,
                 uint64_t *t_dec,uint64_t *s)

{
  byte *__ptr;
  uint8_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  size_t sVar4;
  uint64_t uVar5;
  ulong local_2028;
  ulong local_2018;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  uint64_t t_end;
  uint64_t t_medium;
  uint64_t t_start;
  uint64_t old_h;
  size_t i_max;
  size_t d_len;
  size_t e_len;
  size_t k;
  size_t i;
  uint64_t h [4];
  uint8_t *v_dec;
  uint8_t *v_enc [1000];
  uint8_t *v_in;
  int ret;
  uint64_t *t_dec_local;
  uint64_t *t_enc_local;
  size_t l_local;
  size_t n_local;
  ptls_aead_context_t *d_local;
  ptls_aead_context_t *e_local;
  
  v_in._4_4_ = 0;
  v_enc[999] = (uint8_t *)0x0;
  *t_enc = 0;
  *t_dec = 0;
  *s = 0;
  memset(&v_dec,0,8000);
  memset(&i,0,0x20);
  v_enc[999] = (uint8_t *)malloc(l);
  __ptr = (byte *)malloc(l);
  if ((v_enc[999] == (uint8_t *)0x0) || (__ptr == (byte *)0x0)) {
    v_in._4_4_ = 0x201;
  }
  for (k = 0; v_in._4_4_ == 0 && k < 1000; k = k + 1) {
    puVar1 = (uint8_t *)malloc(l + 0x40);
    v_enc[k - 1] = puVar1;
    if (v_enc[k - 1] == (uint8_t *)0x0) {
      v_in._4_4_ = 0x201;
    }
  }
  if (v_in._4_4_ == 0) {
    memset(v_enc[999],0,l);
    for (e_len = 0; sVar4 = i, e_len < n; e_len = local_2028 + e_len) {
      if (n - e_len < 0x3e9) {
        local_2028 = n - e_len;
      }
      else {
        local_2028 = 1000;
      }
      uVar2 = bench_time();
      for (i_2 = 0; i_2 < local_2028; i_2 = i_2 + 1) {
        i = i + 1;
        d_len = ptls_aead_encrypt(e,v_enc[i_2 - 1],v_enc[999],l,i,&i,0x20);
        *s = (ulong)v_enc[i_2 - 1][l] + *s;
      }
      uVar3 = bench_time();
      i = sVar4;
      for (i_3 = 0; i_3 < local_2028; i_3 = i_3 + 1) {
        i = i + 1;
        sVar4 = ptls_aead_decrypt(d,__ptr,v_enc[i_3 - 1],d_len,i,&i,0x20);
        if (sVar4 != l) {
          v_in._4_4_ = 0x33;
          break;
        }
        *s = (ulong)*__ptr + *s;
      }
      uVar5 = bench_time();
      *t_enc = (uVar3 - uVar2) + *t_enc;
      *t_dec = (uVar5 - uVar3) + *t_dec;
    }
  }
  if (v_enc[999] != (uint8_t *)0x0) {
    free(v_enc[999]);
  }
  for (local_2018 = 0; local_2018 < 1000; local_2018 = local_2018 + 1) {
    if (v_enc[local_2018 - 1] != (uint8_t *)0x0) {
      free(v_enc[local_2018 - 1]);
    }
  }
  if (__ptr != (byte *)0x0) {
    free(__ptr);
  }
  return v_in._4_4_;
}

Assistant:

static int bench_run_one(ptls_aead_context_t *e, ptls_aead_context_t *d, size_t n, size_t l, uint64_t *t_enc, uint64_t *t_dec,
                         uint64_t *s)
{
    int ret = 0;
    uint8_t *v_in = NULL;
    uint8_t *v_enc[BENCH_BATCH];
    uint8_t *v_dec = NULL;
    uint64_t h[4];

    *t_enc = 0;
    *t_dec = 0;
    *s = 0;

    memset(v_enc, 0, sizeof(v_enc));
    memset(h, 0, sizeof(h));
    v_in = (uint8_t *)malloc(l);
    v_dec = (uint8_t *)malloc(l);
    if (v_in == NULL || v_dec == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
    }

    for (size_t i = 0; ret == 0 && i < BENCH_BATCH; i++) {
        v_enc[i] = (uint8_t *)malloc(l + PTLS_MAX_DIGEST_SIZE);
        if (v_enc[i] == 0) {
            ret = PTLS_ERROR_NO_MEMORY;
        }
    }

    if (ret == 0) {
        memset(v_in, 0, l);

        for (size_t k = 0; k < n;) {
            size_t e_len;
            size_t d_len;
            size_t i_max = ((n - k) > BENCH_BATCH) ? BENCH_BATCH : n - k;
            uint64_t old_h = h[0];
            uint64_t t_start = bench_time();
            uint64_t t_medium;
            uint64_t t_end;

            for (size_t i = 0; i < i_max; i++) {
                h[0]++;
                e_len = ptls_aead_encrypt(e, v_enc[i], v_in, l, h[0], h, sizeof(h));
                *s += (v_enc[i])[l];
            }

            t_medium = bench_time();

            h[0] = old_h;

            for (size_t i = 0; i < i_max; i++) {
                h[0]++;

                d_len = ptls_aead_decrypt(d, v_dec, v_enc[i], e_len, h[0], h, sizeof(h));
                if (d_len != l) {
                    ret = PTLS_ALERT_DECRYPT_ERROR;
                    break;
                }
                *s += v_dec[0];
            }

            t_end = bench_time();

            *t_enc += t_medium - t_start;
            *t_dec += t_end - t_medium;

            k += i_max;
        }
    }

    if (v_in != NULL) {
        free(v_in);
    }

    for (size_t i = 0; i < BENCH_BATCH; i++) {
        if (v_enc[i] != NULL) {
            free(v_enc[i]);
        }
    }

    if (v_dec != NULL) {
        free(v_dec);
    }

    return ret;
}